

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_failure_nullptr_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve((void *)0x0,0x20,false,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x14f);
    if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x150);
      return;
    }
    pcVar5 = "0";
    pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
    pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount";
    line = 0x150;
    sVar2 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar2 = (size_t)bVar1;
    pcVar5 = "false";
    pcVar3 = 
    "private_ACUtils_ADynArray_reserve(arrayPtr, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(arrayPtr)->buffer)) == false"
    ;
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(arrayPtr, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(arrayPtr)->buffer))"
    ;
    line = 0x14f;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,pcVar4,sVar2,pcVar5,0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_nullptr)
{
    struct private_ACUtilsTest_ADynArray_CharArray *arrayPtr = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(arrayPtr, private_ACUtilsTest_ADynArray_capacityMax), false);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
}